

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

void __thiscall QtPrivate::QCalendarTextNavigator::removeDateLabel(QCalendarTextNavigator *this)

{
  QCalendarDateValidator *this_00;
  
  if (this->m_dateFrame != (QFrame *)0x0) {
    QBasicTimer::stop();
    QWidget::hide(&this->m_dateFrame->super_QWidget);
    QObject::deleteLater();
    this_00 = this->m_dateValidator;
    if (this_00 != (QCalendarDateValidator *)0x0) {
      QCalendarDateValidator::~QCalendarDateValidator(this_00);
      operator_delete(this_00,0xb0);
    }
    this->m_dateValidator = (QCalendarDateValidator *)0x0;
    this->m_dateText = (QLabel *)0x0;
    this->m_dateFrame = (QFrame *)0x0;
  }
  return;
}

Assistant:

void QCalendarTextNavigator::removeDateLabel()
{
    if (!m_dateFrame)
        return;
    m_acceptTimer.stop();
    m_dateFrame->hide();
    m_dateFrame->deleteLater();
    delete m_dateValidator;
    m_dateFrame = nullptr;
    m_dateText = nullptr;
    m_dateValidator = nullptr;
}